

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

void Abc_AigDeleteNode(Abc_Aig_t *pMan,Abc_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Abc_Obj_t *pNode_00;
  Abc_Obj_t *pAVar4;
  long lVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  do {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d2,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d3,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if ((pNode->vFanins).nSize != 2) {
      __assert_fail("Abc_ObjFaninNum(pNode) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d4,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if ((pNode->vFanouts).nSize != 0) {
      __assert_fail("Abc_ObjFanoutNum(pNode) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d5,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    pVVar7 = pMan->vStackReplaceOld;
    if (0 < pVVar7->nSize) {
      lVar5 = 0;
      do {
        if ((Abc_Obj_t *)pVVar7->pArray[lVar5] == pNode) {
          pVVar7 = pMan->vStackReplaceOld;
          lVar8 = (long)pVVar7->nSize + -1;
          lVar9 = lVar5;
          if (lVar5 < lVar8) {
            do {
              pVVar7->pArray[lVar9] = pVVar7->pArray[lVar9 + 1];
              ppvVar6 = pMan->vStackReplaceNew->pArray;
              ppvVar6[lVar9] = ppvVar6[lVar9 + 1];
              lVar9 = lVar9 + 1;
              pVVar7 = pMan->vStackReplaceOld;
              lVar8 = (long)pVVar7->nSize + -1;
            } while (lVar9 < lVar8);
          }
          pVVar7->nSize = (int)lVar8;
          piVar3 = &pMan->vStackReplaceNew->nSize;
          *piVar3 = *piVar3 + -1;
        }
        lVar5 = lVar5 + 1;
        pVVar7 = pMan->vStackReplaceOld;
      } while (lVar5 < pVVar7->nSize);
    }
    lVar5 = (long)pMan->vStackReplaceNew->nSize;
    if (0 < lVar5) {
      lVar9 = 0;
      do {
        if ((Abc_Obj_t *)((ulong)pMan->vStackReplaceNew->pArray[lVar9] & 0xfffffffffffffffe) ==
            pNode) {
          return;
        }
        lVar9 = lVar9 + 1;
      } while (lVar5 != lVar9);
    }
    piVar3 = (pNode->vFanins).pArray;
    ppvVar6 = pNode->pNtk->vObjs->pArray;
    pNode_00 = (Abc_Obj_t *)ppvVar6[*piVar3];
    pAVar4 = (Abc_Obj_t *)ppvVar6[piVar3[1]];
    pVVar7 = pMan->vUpdatedNets;
    if (pVVar7 != (Vec_Ptr_t *)0x0) {
      uVar1 = pVVar7->nSize;
      if (0 < (long)(int)uVar1) {
        lVar5 = 0;
        do {
          if ((Abc_Obj_t *)pVVar7->pArray[lVar5] == pNode_00) goto LAB_0082e485;
          lVar5 = lVar5 + 1;
        } while ((int)uVar1 != lVar5);
      }
      uVar2 = pVVar7->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
          }
          pVVar7->pArray = ppvVar6;
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar2 * 2;
          if (iVar10 <= (int)uVar2) goto LAB_0082e472;
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
          }
          pVVar7->pArray = ppvVar6;
        }
        pVVar7->nCap = iVar10;
      }
LAB_0082e472:
      iVar10 = pVVar7->nSize;
      pVVar7->nSize = iVar10 + 1;
      pVVar7->pArray[iVar10] = pNode_00;
LAB_0082e485:
      pVVar7 = pMan->vUpdatedNets;
      uVar1 = pVVar7->nSize;
      if (0 < (long)(int)uVar1) {
        lVar5 = 0;
        do {
          if ((Abc_Obj_t *)pVVar7->pArray[lVar5] == pAVar4) goto LAB_0082e524;
          lVar5 = lVar5 + 1;
        } while ((int)uVar1 != lVar5);
      }
      uVar2 = pVVar7->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
          }
          pVVar7->pArray = ppvVar6;
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar2 * 2;
          if (iVar10 <= (int)uVar2) goto LAB_0082e511;
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
          }
          pVVar7->pArray = ppvVar6;
        }
        pVVar7->nCap = iVar10;
      }
LAB_0082e511:
      iVar10 = pVVar7->nSize;
      pVVar7->nSize = iVar10 + 1;
      pVVar7->pArray[iVar10] = pAVar4;
    }
LAB_0082e524:
    Abc_AigAndDelete(pMan,pNode);
    if ((pNode->field_0x14 & 0x10) != 0) {
      Abc_AigRemoveFromLevelStructure(pMan->vLevels,pNode);
    }
    if ((pNode->field_0x14 & 0x20) != 0) {
      Abc_AigRemoveFromLevelStructureR(pMan->vLevelsR,pNode);
    }
    Abc_NtkDeleteObj(pNode);
    if (((*(uint *)&pNode_00->field_0x14 & 0xf) == 7) && ((pNode_00->vFanouts).nSize == 0)) {
      Abc_AigDeleteNode(pMan,pNode_00);
    }
    if (((*(uint *)&pAVar4->field_0x14 & 0xf) != 7) ||
       (pNode = pAVar4, (pAVar4->vFanouts).nSize != 0)) {
      return;
    }
  } while( true );
}

Assistant:

void Abc_AigDeleteNode( Abc_Aig_t * pMan, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode0, * pNode1, * pTemp;
    int i, k;

    // make sure the node is regular and dangling
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( Abc_ObjFaninNum(pNode) == 2 );
    assert( Abc_ObjFanoutNum(pNode) == 0 );

    // when deleting an old node that is scheduled for replacement, remove it from the replacement queue
    Vec_PtrForEachEntry( Abc_Obj_t *, pMan->vStackReplaceOld, pTemp, i )
        if ( pNode == pTemp )
        {
            // remove the entry from the replacement array
            for ( k = i; k < pMan->vStackReplaceOld->nSize - 1; k++ )
            {
                pMan->vStackReplaceOld->pArray[k] = pMan->vStackReplaceOld->pArray[k+1];
                pMan->vStackReplaceNew->pArray[k] = pMan->vStackReplaceNew->pArray[k+1];
            }
            pMan->vStackReplaceOld->nSize--;
            pMan->vStackReplaceNew->nSize--;
        }

    // when deleting a new node that should replace another node, do not delete
    Vec_PtrForEachEntry( Abc_Obj_t *, pMan->vStackReplaceNew, pTemp, i )
        if ( pNode == Abc_ObjRegular(pTemp) )
            return;

    // remember the node's fanins
    pNode0 = Abc_ObjFanin0( pNode );
    pNode1 = Abc_ObjFanin1( pNode );

    // add the node to the list of updated nodes
    if ( pMan->vUpdatedNets )
    {
        Vec_PtrPushUnique( pMan->vUpdatedNets, pNode0 );
        Vec_PtrPushUnique( pMan->vUpdatedNets, pNode1 );
    }

    // remove the node from the table
    Abc_AigAndDelete( pMan, pNode );
    // if the node is in the level structure, remove it
    if ( pNode->fMarkA )
        Abc_AigRemoveFromLevelStructure( pMan->vLevels, pNode );
    if ( pNode->fMarkB )
        Abc_AigRemoveFromLevelStructureR( pMan->vLevelsR, pNode );
    // remove the node from the network
    Abc_NtkDeleteObj( pNode );

    // call recursively for the fanins
    if ( Abc_ObjIsNode(pNode0) && pNode0->vFanouts.nSize == 0 )
        Abc_AigDeleteNode( pMan, pNode0 );
    if ( Abc_ObjIsNode(pNode1) && pNode1->vFanouts.nSize == 0 )
        Abc_AigDeleteNode( pMan, pNode1 );
}